

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

QueryId __thiscall
helics::Federate::queryAsync
          (Federate *this,string_view target,string_view queryStr,HelicsSequencingModes mode)

{
  atomic<int> *paVar1;
  __int_type_conflict _Var2;
  Federate *pFVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *p_Var5;
  InvalidFunctionCall *this_00;
  size_t sVar6;
  size_t sVar7;
  undefined4 in_register_0000008c;
  _State_baseV2 *__tmp;
  string_view message;
  undefined4 in_stack_00000008;
  __allocator_type __a2;
  int cnt;
  undefined4 uStack_c4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_c0;
  handle asyncInfo;
  __allocator_type __a2_1;
  thread local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  Federate *local_60;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> queryFut;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  sVar6 = queryStr._M_len;
  sVar7 = target._M_len;
  if (*(char *)(sVar7 + 0xe) != '\x01') {
    _cnt = (pointer)0x0;
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    (((__mutex_base *)&p_Var4->_vptr__Sp_counted_base)->_M_mutex).__align =
         (long)&PTR___Sp_counted_ptr_inplace_004c66c0;
    p_Var4[1]._M_use_count = 0;
    p_Var4[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var4[2]._M_use_count = 0;
    asyncInfo.data = (pointer)&__a2;
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[3]._M_use_count = 0;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_004c6710;
    asyncInfo.m_handle_lock._M_device = (mutex_type *)p_Var4;
    local_60 = this;
    p_Var5 = (_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)operator_new(0x38);
    std::__future_base::
    _Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    _Result(p_Var5);
    p_Var4[4]._vptr__Sp_counted_base = (_func_int **)p_Var5;
    p_Var4[4]._M_use_count = (int)sVar7;
    p_Var4[4]._M_weak_count = (int)(sVar7 >> 0x20);
    (((__mutex_base *)&p_Var4[5]._vptr__Sp_counted_base)->_M_mutex).__align = (long)target._M_str;
    p_Var4[5]._M_use_count = (int)sVar6;
    p_Var4[5]._M_weak_count = (int)(sVar6 >> 0x20);
    p_Var4[6]._vptr__Sp_counted_base = (_func_int **)queryStr._M_str;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var4[6]._M_use_count =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000008c,mode);
    *(undefined4 *)&p_Var4[7]._vptr__Sp_counted_base = in_stack_00000008;
    local_78._M_id._M_thread = (id)0;
    ___a2_1 = (element_type *)operator_new(0x20);
    ___a2_1->_vptr__State_baseV2 = (_func_int **)&PTR___State_004c6768;
    (___a2_1->_M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)(p_Var4 + 1);
    *(code **)&___a2_1->_M_status =
         std::__future_base::
         _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::_M_run;
    *(undefined8 *)&___a2_1->_M_once = 0;
    local_70 = (element_type *)queryStr._M_str;
    local_68._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000008c,mode);
    std::thread::_M_start_thread(&local_78,&__a2_1,0);
    pFVar3 = local_60;
    if (___a2_1 != (element_type *)0x0) {
      (*___a2_1->_vptr__State_baseV2[1])();
    }
    CLI::std::thread::operator=((thread *)(p_Var4 + 3),&local_78);
    CLI::std::thread::~thread(&local_78);
    asyncInfo.m_handle_lock._M_device = (mutex_type *)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&asyncInfo);
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    asyncInfo.data = _cnt;
    asyncInfo.m_handle_lock._M_device = (mutex_type *)_Stack_c0._M_pi;
    _cnt = (pointer)(p_Var4 + 1);
    _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&asyncInfo.m_handle_lock);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    if (_cnt == (pointer)0x0) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
      asyncInfo.data = (pointer)&__a2_1;
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      (((__mutex_base *)&p_Var4->_vptr__Sp_counted_base)->_M_mutex).__align =
           (long)&PTR___Sp_counted_ptr_inplace_004c67a8;
      p_Var4[1]._M_use_count = 0;
      p_Var4[1]._M_weak_count = 0;
      *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
      *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_004c67f8;
      asyncInfo.m_handle_lock._M_device = (mutex_type *)p_Var4;
      p_Var5 = (_Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x38);
      std::__future_base::
      _Result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      _Result(p_Var5);
      p_Var4[3]._vptr__Sp_counted_base = (_func_int **)p_Var5;
      p_Var4[3]._M_use_count = (int)sVar7;
      p_Var4[3]._M_weak_count = (int)(sVar7 >> 0x20);
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)target._M_str;
      p_Var4[4]._M_use_count = (int)sVar6;
      p_Var4[4]._M_weak_count = (int)(sVar6 >> 0x20);
      (((__mutex_base *)&p_Var4[5]._vptr__Sp_counted_base)->_M_mutex).__align = (long)local_70;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var4[5]._M_use_count = local_68._M_pi;
      *(undefined4 *)&p_Var4[6]._vptr__Sp_counted_base = in_stack_00000008;
      asyncInfo.m_handle_lock._M_device = (mutex_type *)0x0;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_application_api_Federate_cpp:1858:52)>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&asyncInfo);
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      asyncInfo.data = _cnt;
      asyncInfo.m_handle_lock._M_device = (mutex_type *)_Stack_c0._M_pi;
      _cnt = (pointer)(p_Var4 + 1);
      _Stack_c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&asyncInfo.m_handle_lock);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
    }
    std::
    __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::__basic_future(&queryFut.
                      super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ,(__state_type *)&cnt);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_c0);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&asyncInfo,*(shared_guarded<helics::AsyncFedCallInfo,_std::mutex> **)(sVar7 + 0x58));
    LOCK();
    paVar1 = &(asyncInfo.data)->queryCounter;
    _Var2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    _cnt = (pointer)CONCAT44(uStack_c4,_Var2);
    std::
    _Rb_tree<int,std::pair<int_const,std::future<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::future<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
    ::_M_emplace_unique<int&,std::future<std::__cxx11::string>>
              ((_Rb_tree<int,std::pair<int_const,std::future<std::__cxx11::string>>,std::_Select1st<std::pair<int_const,std::future<std::__cxx11::string>>>,std::less<int>,std::allocator<std::pair<int_const,std::future<std::__cxx11::string>>>>
                *)&(asyncInfo.data)->inFlightQueries,&cnt,&queryFut);
    *(int *)&pFVar3->_vptr_Federate = cnt;
    std::unique_lock<std::mutex>::~unique_lock(&asyncInfo.m_handle_lock);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &queryFut.
                super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return (QueryId)(uint)pFVar3;
  }
  this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
  message._M_str = "No Async calls are allowed in single thread federates";
  message._M_len = 0x35;
  InvalidFunctionCall::InvalidFunctionCall(this_00,message);
  __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

QueryId Federate::queryAsync(std::string_view target,
                             std::string_view queryStr,
                             HelicsSequencingModes mode)
{
    if (singleThreadFederate) {
        throw(helics::InvalidFunctionCall("No Async calls are allowed in single thread federates"));
    }
    auto queryFut = std::async(std::launch::async, [this, target, queryStr, mode]() {
        return coreObject->query(target, queryStr, mode);
    });
    auto asyncInfo = asyncCallInfo->lock();
    int cnt = asyncInfo->queryCounter++;

    asyncInfo->inFlightQueries.emplace(cnt, std::move(queryFut));
    return QueryId(cnt);
}